

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_m2mf.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::M2mf::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,M2mf *this)

{
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  SingleMthdTest *this_00;
  result_type rVar1;
  MthdNotify *this_01;
  MthdPmTrigger *this_02;
  MthdDmaNotify *this_03;
  MthdDmaGrobj *pMVar2;
  MthdM2mfOffset *pMVar3;
  MthdM2mfPitch *pMVar4;
  MthdM2mfLineLength *this_04;
  MthdM2mfLineCount *this_05;
  MthdM2mfFormat *this_06;
  MthdM2mfTrigger *this_07;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_2d3;
  undefined1 local_2d2;
  allocator local_2d1;
  string local_2d0 [38];
  undefined1 local_2aa;
  allocator local_2a9;
  string local_2a8 [38];
  undefined1 local_282;
  allocator local_281;
  string local_280 [38];
  undefined1 local_25a;
  allocator local_259;
  string local_258 [38];
  undefined1 local_232;
  allocator local_231;
  string local_230 [38];
  undefined1 local_20a;
  allocator local_209;
  string local_208 [38];
  undefined1 local_1e2;
  allocator local_1e1;
  string local_1e0 [38];
  undefined1 local_1ba;
  allocator local_1b9;
  string local_1b8 [38];
  undefined1 local_192;
  allocator local_191;
  string local_190 [38];
  undefined1 local_16a;
  allocator local_169;
  string local_168 [38];
  undefined1 local_142;
  allocator local_141;
  string local_140 [38];
  undefined1 local_11a;
  allocator local_119;
  string local_118 [38];
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [38];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [48];
  SingleMthdTest *local_98;
  MthdNotify *local_90;
  MthdPmTrigger *local_88;
  MthdDmaNotify *local_80;
  MthdDmaGrobj *local_78;
  MthdDmaGrobj *local_70;
  MthdM2mfOffset *local_68;
  MthdM2mfOffset *local_60;
  MthdM2mfPitch *local_58;
  MthdM2mfPitch *local_50;
  MthdM2mfLineLength *local_48;
  MthdM2mfLineCount *local_40;
  MthdM2mfFormat *local_38;
  MthdM2mfTrigger *local_30;
  iterator local_28;
  size_type local_20;
  M2mf *local_18;
  M2mf *this_local;
  
  local_18 = this;
  this_local = (M2mf *)__return_storage_ptr__;
  this_00 = (SingleMthdTest *)operator_new(0x25950);
  local_ca = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"nop",&local_c9);
  MthdNop::SingleMthdTest
            ((MthdNop *)this_00,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_c8,-1,
             (this->super_Class).cls,0x100,1,4);
  local_ca = 0;
  local_98 = this_00;
  this_01 = (MthdNotify *)operator_new(0x25950);
  local_f2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"notify",&local_f1);
  MthdNotify::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_f0,0,
             (this->super_Class).cls,0x104,1,4);
  local_f2 = 0;
  local_90 = this_01;
  this_02 = (MthdPmTrigger *)operator_new(0x25950);
  local_11a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"pm_trigger",&local_119);
  MthdPmTrigger::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_118,-1,
             (this->super_Class).cls,0x140,1,4);
  local_11a = 0;
  local_88 = this_02;
  this_03 = (MthdDmaNotify *)operator_new(0x25950);
  local_142 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"dma_notify",&local_141);
  MthdDmaNotify::SingleMthdTest
            (this_03,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_140,1,
             (this->super_Class).cls,0x180,1,4);
  local_142 = 0;
  local_80 = this_03;
  pMVar2 = (MthdDmaGrobj *)operator_new(0x25960);
  local_16a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"dma_in",&local_169);
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_168,2,
             (this->super_Class).cls,0x184,0,2);
  local_16a = 0;
  local_78 = pMVar2;
  pMVar2 = (MthdDmaGrobj *)operator_new(0x25960);
  local_192 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"dma_out",&local_191);
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_190,3,
             (this->super_Class).cls,0x188,1,9);
  local_192 = 0;
  local_70 = pMVar2;
  pMVar3 = (MthdM2mfOffset *)operator_new(0x25958);
  local_1ba = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"offset_in",&local_1b9);
  anon_unknown_10::MthdM2mfOffset::MthdM2mfOffset
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1b8,4,
             (this->super_Class).cls,0x30c,0);
  local_1ba = 0;
  local_68 = pMVar3;
  pMVar3 = (MthdM2mfOffset *)operator_new(0x25958);
  local_1e2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"offset_out",&local_1e1);
  anon_unknown_10::MthdM2mfOffset::MthdM2mfOffset
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1e0,5,
             (this->super_Class).cls,0x310,1);
  local_1e2 = 0;
  local_60 = pMVar3;
  pMVar4 = (MthdM2mfPitch *)operator_new(0x25958);
  local_20a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"pitch_in",&local_209);
  anon_unknown_10::MthdM2mfPitch::MthdM2mfPitch
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_208,6,
             (this->super_Class).cls,0x314,0);
  local_20a = 0;
  local_58 = pMVar4;
  pMVar4 = (MthdM2mfPitch *)operator_new(0x25958);
  local_232 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"pitch_out",&local_231);
  anon_unknown_10::MthdM2mfPitch::MthdM2mfPitch
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_230,7,
             (this->super_Class).cls,0x318,1);
  local_232 = 0;
  local_50 = pMVar4;
  this_04 = (MthdM2mfLineLength *)operator_new(0x25950);
  local_25a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"line_length",&local_259);
  anon_unknown_10::MthdM2mfLineLength::SingleMthdTest
            (this_04,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_258,8,
             (this->super_Class).cls,0x31c,1,4);
  local_25a = 0;
  local_48 = this_04;
  this_05 = (MthdM2mfLineCount *)operator_new(0x25950);
  local_282 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"line_count",&local_281);
  anon_unknown_10::MthdM2mfLineCount::SingleMthdTest
            (this_05,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_280,9,
             (this->super_Class).cls,800,1,4);
  local_282 = 0;
  local_40 = this_05;
  this_06 = (MthdM2mfFormat *)operator_new(0x25950);
  local_2aa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"format",&local_2a9);
  anon_unknown_10::MthdM2mfFormat::SingleMthdTest
            (this_06,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2a8,10,
             (this->super_Class).cls,0x324,1,4);
  local_2aa = 0;
  local_38 = this_06;
  this_07 = (MthdM2mfTrigger *)operator_new(0x25950);
  local_2d2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"trigger",&local_2d1);
  anon_unknown_10::MthdM2mfTrigger::SingleMthdTest
            (this_07,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2d0,0xb,
             (this->super_Class).cls,0x328,1,4);
  local_2d2 = 0;
  local_28 = &local_98;
  local_20 = 0xe;
  local_30 = this_07;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_2d3);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l,&local_2d3);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_2d3);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> M2mf::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_in", 2, cls, 0x184, 0, DMA_R | DMA_CLR),
		new MthdDmaGrobj(opt, rnd(), "dma_out", 3, cls, 0x188, 1, DMA_W | DMA_CHECK_PREV),
		new MthdM2mfOffset(opt, rnd(), "offset_in", 4, cls, 0x30c, 0),
		new MthdM2mfOffset(opt, rnd(), "offset_out", 5, cls, 0x310, 1),
		new MthdM2mfPitch(opt, rnd(), "pitch_in", 6, cls, 0x314, 0),
		new MthdM2mfPitch(opt, rnd(), "pitch_out", 7, cls, 0x318, 1),
		new MthdM2mfLineLength(opt, rnd(), "line_length", 8, cls, 0x31c),
		new MthdM2mfLineCount(opt, rnd(), "line_count", 9, cls, 0x320),
		new MthdM2mfFormat(opt, rnd(), "format", 10, cls, 0x324),
		new MthdM2mfTrigger(opt, rnd(), "trigger", 11, cls, 0x328),
	};
}